

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_147394::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  float fVar1;
  PixelType PVar2;
  size_t __n;
  bool bVar3;
  PixelType PVar4;
  ulong __n_00;
  Array2D<void_*> *pAVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  float *pfVar11;
  float *pfVar12;
  undefined4 *puVar13;
  int *piVar14;
  ChannelList *this;
  ChannelList *pCVar15;
  int *piVar16;
  void *pvVar17;
  void *pvVar18;
  ostream *poVar19;
  long lVar20;
  void *pvVar21;
  long *plVar22;
  void **ppvVar23;
  undefined4 uVar24;
  int iVar25;
  int iVar26;
  undefined7 in_register_00000009;
  char *pcVar27;
  long lVar28;
  long lVar29;
  int i;
  uint uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  char *pcVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  int j;
  long lVar41;
  long lVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 auStack_388 [8];
  ulong local_380;
  long local_378;
  long local_370;
  void *local_368;
  Array<Imf_3_4::Array2D<void_*>_> data;
  long local_348;
  long local_340;
  int local_338;
  DeepTiledInputFile file;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  _Base_ptr local_2f0;
  int local_2bc;
  string str;
  Box2i box;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int local_1b4;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar24 = (undefined4)CONCAT71(in_register_00000009,randomChannels);
  if (bulkRead && relativeCoords) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1b6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile(&file,(filename->_M_dataplus)._M_p,4);
  Imf_3_4::DeepTiledInputFile::header();
  puVar9 = (undefined8 *)Imf_3_4::Header::displayWindow();
  puVar10 = (undefined8 *)Imf_3_4::Header::displayWindow();
  iVar48 = -(uint)((int)*puVar10 == (int)*puVar9);
  iVar49 = -(uint)((int)((ulong)*puVar10 >> 0x20) == (int)((ulong)*puVar9 >> 0x20));
  auVar44._4_4_ = iVar48;
  auVar44._0_4_ = iVar48;
  auVar44._8_4_ = iVar49;
  auVar44._12_4_ = iVar49;
  iVar48 = movmskpd(uVar24,auVar44);
  if ((iVar48 != 3) ||
     (iVar49 = -(uint)((int)puVar10[1] == (int)puVar9[1]),
     iVar50 = -(uint)((int)((ulong)puVar10[1] >> 0x20) == (int)((ulong)puVar9[1] >> 0x20)),
     auVar45._4_4_ = iVar49, auVar45._0_4_ = iVar49, auVar45._8_4_ = iVar50, auVar45._12_4_ = iVar50
     , iVar49 = movmskpd((int)puVar10,auVar45), iVar49 != 3)) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bd,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar9 = (undefined8 *)Imf_3_4::Header::dataWindow();
  puVar10 = (undefined8 *)Imf_3_4::Header::dataWindow();
  iVar49 = -(uint)((int)*puVar10 == (int)*puVar9);
  iVar50 = -(uint)((int)((ulong)*puVar10 >> 0x20) == (int)((ulong)*puVar9 >> 0x20));
  auVar46._4_4_ = iVar49;
  auVar46._0_4_ = iVar49;
  auVar46._8_4_ = iVar50;
  auVar46._12_4_ = iVar50;
  iVar48 = movmskpd(iVar48,auVar46);
  if ((iVar48 != 3) ||
     (iVar48 = -(uint)((int)puVar10[1] == (int)puVar9[1]),
     iVar49 = -(uint)((int)((ulong)puVar10[1] >> 0x20) == (int)((ulong)puVar9[1] >> 0x20)),
     auVar47._4_4_ = iVar48, auVar47._0_4_ = iVar48, auVar47._8_4_ = iVar49, auVar47._12_4_ = iVar49
     , iVar48 = movmskpd((int)puVar10,auVar47), iVar48 != 3)) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1be,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = (float *)Imf_3_4::Header::pixelAspectRatio();
  local_380._0_4_ = *pfVar11;
  pfVar11 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if (((float)local_380 != *pfVar11) || (NAN((float)local_380) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bf,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = (float *)Imf_3_4::Header::screenWindowCenter();
  pfVar12 = (float *)Imf_3_4::Header::screenWindowCenter();
  if ((((*pfVar11 != *pfVar12) || (NAN(*pfVar11) || NAN(*pfVar12))) || (pfVar11[1] != pfVar12[1]))
     || (NAN(pfVar11[1]) || NAN(pfVar12[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar13 = (undefined4 *)Imf_3_4::Header::screenWindowWidth();
  local_380 = CONCAT44(local_380._4_4_,*puVar13);
  pfVar11 = (float *)Imf_3_4::Header::screenWindowWidth();
  if (((float)local_380 != *pfVar11) || (NAN((float)local_380) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c1,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar14 = (int *)Imf_3_4::Header::lineOrder();
  iVar48 = *piVar14;
  piVar14 = (int *)Imf_3_4::Header::lineOrder();
  if (iVar48 != *piVar14) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c2,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar14 = (int *)Imf_3_4::Header::compression();
  iVar48 = *piVar14;
  piVar14 = (int *)Imf_3_4::Header::compression();
  if (iVar48 != *piVar14) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this = (ChannelList *)Imf_3_4::Header::channels();
  pCVar15 = (ChannelList *)Imf_3_4::Header::channels();
  cVar6 = Imf_3_4::ChannelList::operator==(this,pCVar15);
  if (cVar6 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c4,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar9 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  puVar10 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  __n = puVar9[1];
  if ((__n != puVar10[1]) ||
     ((__n != 0 && (iVar48 = bcmp((void *)*puVar9,(void *)*puVar10,__n), iVar48 != 0)))) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c5,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar14 = (int *)Imf_3_4::Header::tileDescription();
  piVar16 = (int *)Imf_3_4::Header::tileDescription();
  if ((((*piVar14 != *piVar16) || (piVar14[1] != piVar16[1])) || (piVar14[2] != piVar16[2])) ||
     (piVar14[3] != piVar16[3])) {
    __assert_fail("fileHeader.tileDescription () == header.tileDescription ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pvVar17 = operator_new__(0x2d0e4);
  uVar7 = random_int(3);
  uVar30 = channelCount + uVar7;
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)(int)uVar30);
  if (0 < (int)uVar30) {
    lVar41 = 0;
    do {
      pAVar5 = data._data;
      pvVar18 = operator_new__(0x5a1c8);
      pvVar21 = *(void **)((long)&pAVar5->_data + lVar41);
      if (pvVar21 != (void *)0x0) {
        operator_delete__(pvVar21);
      }
      *(undefined8 *)((long)&pAVar5->_sizeX + lVar41) = 0xa9;
      *(undefined8 *)((long)&pAVar5->_sizeY + lVar41) = 0x111;
      *(void **)((long)&pAVar5->_data + lVar41) = pvVar18;
      lVar41 = lVar41 + 0x18;
    } while ((ulong)uVar30 * 0x18 != lVar41);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  if (relativeCoords) {
    lVar41 = 0;
  }
  else {
    lVar41 = (long)DAT_001eb6d4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_3_4::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar17 + lVar41 * -4),4,0x444,1,1,0.0,relativeCoords,
             relativeCoords);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  __n_00 = (ulong)(uint)channelCount;
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    uVar38 = 0;
    lVar31 = 0x10;
    local_380 = lVar41 * -8;
    iVar48 = 0;
    do {
      if (randomChannels) {
        iVar49 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar38] = iVar49;
        if (iVar49 == 1) goto LAB_0015894a;
      }
      else {
LAB_0015894a:
        PVar2 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar38 * 4);
        PVar4 = (uint)(PVar2 != UINT) * 3;
        if (PVar2 == HALF) {
          PVar4 = PVar2;
        }
        if (PVar2 == FLOAT) {
          PVar4 = PVar2;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1a8,(int)uVar38);
        std::__cxx11::stringbuf::str();
        iVar49 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
        uVar36 = (ulong)(iVar49 == 0) << 2;
        if (iVar49 == 1) {
          uVar36 = 2;
        }
        if (iVar49 == 2) {
          uVar36 = 4;
        }
        Imf_3_4::DeepSlice::DeepSlice
                  ((DeepSlice *)&box,PVar4,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar31) + local_380),8,0x888,
                   uVar36,1,1,0.0,relativeCoords,relativeCoords);
        Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar48 = iVar48 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      uVar38 = uVar38 + 1;
      lVar31 = lVar31 + 0x18;
    } while (__n_00 != uVar38);
    if (iVar48 != 0) {
      if (0 < (int)uVar7) {
        lVar41 = __n_00 * 0x18;
        uVar38 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar19 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)&box,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar41) + local_380),8,0x888,4,
                     1,1,0.0,relativeCoords,relativeCoords);
          Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_138);
          uVar38 = uVar38 + 1;
          lVar41 = lVar41 + 0x18;
        } while (uVar7 != uVar38);
      }
      Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      pcVar27 = "per-tile ";
      if (relativeCoords) {
        pcVar27 = "per-tile with relative coordinates ";
      }
      lVar41 = 9;
      if (relativeCoords) {
        lVar41 = 0x23;
      }
      pcVar34 = "bulk ";
      if (!bulkRead) {
        pcVar34 = pcVar27;
      }
      lVar31 = 5;
      if (!bulkRead) {
        lVar31 = lVar41;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar34,lVar31);
      std::ostream::flush();
      lVar41 = (ulong)uVar7 * 0x18;
      local_378 = 0;
      while (iVar48 = Imf_3_4::DeepTiledInputFile::numYLevels(), local_378 < iVar48) {
        local_370 = 0;
        while( true ) {
          iVar48 = Imf_3_4::DeepTiledInputFile::numXLevels();
          if (iVar48 <= local_370) break;
          Imf_3_4::DeepTiledInputFile::dataWindowForLevel((int)&ss,(int)&file);
          if (bulkRead) {
            iVar48 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file);
            iVar49 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file);
            Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
                      ((int)&file,0,iVar48 + -1,0,iVar49 + -1,(int)local_370);
            for (iVar48 = 0;
                iVar49 = Imf_3_4::DeepTiledInputFile::numYTiles((int)auStack_388 + 0x80),
                iVar48 < iVar49; iVar48 = iVar48 + 1) {
              for (iVar49 = 0; iVar50 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file),
                  iVar49 < iVar50; iVar49 = iVar49 + 1) {
                Imf_3_4::DeepTiledInputFile::dataWindowForTile((int)&box,(int)&file,iVar49,iVar48);
                iVar26 = box.max.x;
                iVar50 = box.min.x;
                local_340 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar31 = (long)box.min.x;
                  lVar28 = (long)_ss;
                  lVar29 = DAT_001eb710 * local_378;
                  iVar8 = box.max.x + 1;
                  iVar37 = box.max.y + 1;
                  do {
                    if (iVar50 <= iVar26) {
                      lVar42 = local_340 - local_1b4;
                      local_368 = (void *)(lVar42 * 0x444 + (long)pvVar17);
                      lVar35 = lVar31;
                      do {
                        lVar32 = lVar35 - lVar28;
                        uVar30 = *(uint *)((long)local_368 + lVar32 * 4);
                        uVar38 = (ulong)uVar30;
                        lVar20 = lVar29 * 0x18 + DAT_001eb718;
                        if (uVar30 != *(uint *)(*(long *)(lVar20 + 8 + local_370 * 0x18) * lVar42 *
                                                4 + *(long *)(lVar20 + 0x10 + local_370 * 0x18) +
                                               lVar32 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x253,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001eb6f8 != (anonymous_namespace)::channelTypes) {
                          local_380 = uVar38 * 2;
                          lVar40 = 4;
                          uVar36 = 0;
                          lVar20 = (anonymous_namespace)::channelTypes;
                          do {
                            iVar25 = *(int *)(lVar20 + uVar36 * 4);
                            if (iVar25 == 0) {
                              pvVar21 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar42 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar21;
                              iVar25 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                              lVar20 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar25 == 1) {
                              pvVar21 = operator_new__(local_380);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar42 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar21;
                              iVar25 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                              lVar20 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar25 == 2) {
                              pvVar21 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar42 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar21;
                              lVar20 = (anonymous_namespace)::channelTypes;
                            }
                            uVar36 = uVar36 + 1;
                            lVar40 = lVar40 + 6;
                          } while (uVar36 < (ulong)(DAT_001eb6f8 - lVar20 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar20 = 0;
                          do {
                            pvVar21 = operator_new__(uVar38 << 2);
                            uVar36 = (ulong)(DAT_001eb6f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar36]._sizeY + lVar20) * lVar42
                                       * 8 + *(long *)((long)&data._data[uVar36]._data + lVar20) +
                                      lVar32 * 8) = pvVar21;
                            lVar20 = lVar20 + 0x18;
                          } while (lVar41 != lVar20);
                        }
                        lVar35 = lVar35 + 1;
                      } while (iVar8 != (int)lVar35);
                    }
                    local_340 = local_340 + 1;
                  } while (iVar37 != (int)local_340);
                }
              }
            }
            iVar48 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file);
            iVar49 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file);
            Imf_3_4::DeepTiledInputFile::readTiles
                      ((int)&file,0,iVar48 + -1,0,iVar49 + -1,(int)local_370);
          }
          else if (relativeCoords) {
            for (local_338 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file),
                local_338 < iVar48; local_338 = local_338 + 1) {
              for (local_2bc = 0; iVar48 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file),
                  local_2bc < iVar48; local_2bc = local_2bc + 1) {
                Imf_3_4::DeepTiledInputFile::readPixelSampleCount
                          ((int)&file,local_2bc,local_338,(int)local_370);
                Imf_3_4::DeepTiledInputFile::dataWindowForTile
                          ((int)&box,(int)&file,local_2bc,local_338);
                iVar48 = box.max.x;
                lVar31 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  local_368 = (void *)(long)box.min.x;
                  lVar28 = (long)_ss;
                  lVar29 = DAT_001eb710 * local_378;
                  iVar50 = box.max.x + 1;
                  iVar49 = box.max.y + 1;
                  local_348 = lVar31;
                  do {
                    if ((int)local_368 <= iVar48) {
                      lVar35 = local_348 - lVar31;
                      pvVar21 = local_368;
                      do {
                        lVar20 = (long)pvVar21 - (long)local_368;
                        uVar30 = *(uint *)((long)pvVar17 + lVar20 * 4 + lVar35 * 0x444);
                        uVar38 = (ulong)uVar30;
                        lVar42 = lVar29 * 0x18 + DAT_001eb718;
                        if (uVar30 != *(uint *)(*(long *)(lVar42 + 8 + local_370 * 0x18) *
                                                (local_348 - local_1b4) * 4 +
                                                *(long *)(lVar42 + 0x10 + local_370 * 0x18) +
                                               ((long)pvVar21 - lVar28) * 4)) {
                          __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x2be,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001eb6f8 != (anonymous_namespace)::channelTypes) {
                          local_380 = uVar38 * 2;
                          lVar32 = 4;
                          uVar36 = 0;
                          lVar42 = (anonymous_namespace)::channelTypes;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar36] == 1)) {
                              iVar26 = *(int *)(lVar42 + uVar36 * 4);
                              if (iVar26 == 0) {
                                pvVar18 = operator_new__(uVar38 * 4);
                                *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar35 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                          lVar20 * 8) = pvVar18;
                                iVar26 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                                lVar42 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar26 == 1) {
                                pvVar18 = operator_new__(local_380);
                                *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar35 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                          lVar20 * 8) = pvVar18;
                                iVar26 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                                lVar42 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar26 == 2) {
                                pvVar18 = operator_new__(uVar38 * 4);
                                *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar35 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                          lVar20 * 8) = pvVar18;
                                lVar42 = (anonymous_namespace)::channelTypes;
                              }
                            }
                            uVar36 = uVar36 + 1;
                            lVar32 = lVar32 + 6;
                          } while (uVar36 < (ulong)(DAT_001eb6f8 - lVar42 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar42 = 0;
                          do {
                            pvVar18 = operator_new__(uVar38 << 2);
                            uVar36 = (ulong)(DAT_001eb6f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar36]._sizeY + lVar42) * lVar35
                                       * 8 + *(long *)((long)&data._data[uVar36]._data + lVar42) +
                                      lVar20 * 8) = pvVar18;
                            lVar42 = lVar42 + 0x18;
                          } while (lVar41 != lVar42);
                        }
                        pvVar21 = (void *)((long)pvVar21 + 1);
                      } while (iVar50 != (int)pvVar21);
                    }
                    local_348 = local_348 + 1;
                  } while (iVar49 != (int)local_348);
                }
                Imf_3_4::DeepTiledInputFile::readTile((int)&file,local_2bc,local_338,(int)local_370)
                ;
                iVar49 = box.max.y;
                iVar50 = box.max.x;
                iVar48 = box.min.y;
                if (box.min.y <= box.max.y) {
                  do {
                    lVar31 = (anonymous_namespace)::channelTypes;
                    lVar28 = DAT_001eb6f8;
                    lVar29 = DAT_001eb6f8;
                    iVar26 = box.min.x;
                    if (box.min.x <= iVar50) {
                      do {
                        lVar42 = (long)iVar48 - (long)box.min.y;
                        lVar20 = (long)iVar26 - (long)box.min.x;
                        lVar35 = lVar31;
                        if (lVar29 != lVar31) {
                          iVar49 = iVar26 - _ss;
                          local_368 = (void *)CONCAT44(local_368._4_4_,iVar48 - local_1b4);
                          iVar50 = ((iVar48 - local_1b4) * 0x111 + iVar49) % 0x801;
                          local_380 = CONCAT44(local_380._4_4_,(float)iVar50);
                          uVar38 = 0;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar38] == 1)) {
                              lVar28 = (long)*(int *)((long)pvVar17 + lVar20 * 4 + lVar42 * 0x444);
                              iVar37 = *(int *)(lVar31 + uVar38 * 4);
                              if (0 < lVar28) {
                                pvVar21 = data._data[uVar38]._data
                                          [data._data[uVar38]._sizeY * lVar42 + lVar20];
                                lVar31 = 0;
                                do {
                                  if (iVar37 == 2) {
                                    fVar43 = *(float *)((long)pvVar21 + lVar31 * 4);
                                    if ((fVar43 != (float)local_380) ||
                                       (NAN(fVar43) || NAN((float)local_380))) {
                                      poVar19 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar49);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar19,", ",2);
                                      poVar19 = (ostream *)
                                                std::ostream::operator<<(poVar19,(int)local_368);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar19," error, should be ",0x12);
                                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar50);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar19,", is ",5);
                                      poVar19 = std::ostream::_M_insert<double>
                                                          ((double)*(float *)((long)pvVar21 +
                                                                             lVar31 * 4));
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar19 + -0x18) +
                                                      (char)poVar19);
                                      std::ostream::put((char)poVar19);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                      fVar43 = *(float *)((long)pvVar21 + lVar31 * 4);
                                    }
                                    if ((fVar43 != (float)local_380) ||
                                       (NAN(fVar43) || NAN((float)local_380))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x1a9,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if (iVar37 == 1) {
                                    fVar43 = *(float *)(_imath_half_to_float_table +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar21 + lVar31 * 2) * 4);
                                    if ((fVar43 != (float)local_380) ||
                                       (NAN(fVar43) || NAN((float)local_380))) {
                                      poVar19 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar49);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar19,", ",2);
                                      poVar19 = (ostream *)
                                                std::ostream::operator<<(poVar19,(int)local_368);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar19," error, should be ",0x12);
                                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar50);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar19,", is ",5);
                                      plVar22 = (long *)::operator<<(poVar19,(half)*(uint16_t *)
                                                                                    ((long)pvVar21 +
                                                                                    lVar31 * 2));
                                      std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) +
                                                      (char)plVar22);
                                      std::ostream::put((char)plVar22);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                      fVar43 = *(float *)(_imath_half_to_float_table +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar21 + lVar31 * 2) * 4);
                                    }
                                    if ((fVar43 != (float)local_380) ||
                                       (NAN(fVar43) || NAN((float)local_380))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x19f,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if ((iVar37 == 0) &&
                                          (*(int *)((long)pvVar21 + lVar31 * 4) != iVar50)) {
                                    poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar49)
                                    ;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar19,", ",2);
                                    poVar19 = (ostream *)
                                              std::ostream::operator<<(poVar19,(int)local_368);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar19," error, should be ",0x12);
                                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar50);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar19,", is ",5);
                                    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19)
                                    ;
                                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18)
                                                    + (char)poVar19);
                                    std::ostream::put((char)poVar19);
                                    std::ostream::flush();
                                    std::ostream::flush();
                                    if (*(int *)((long)pvVar21 + lVar31 * 4) != iVar50) {
                                      __assert_fail(
                                                  "value[l] == static_cast<unsigned int> ((dwy * width + dwx) % 2049)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x195,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  lVar31 = lVar31 + 1;
                                } while (lVar28 != lVar31);
                                iVar37 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar37 == 0) {
                                if (data._data[uVar38]._data
                                    [data._data[uVar38]._sizeY * lVar42 + lVar20] == (void *)0x0)
                                goto LAB_00159835;
                                operator_delete__(data._data[uVar38]._data
                                                  [data._data[uVar38]._sizeY * lVar42 + lVar20]);
                                iVar37 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar37 == 1) {
                                if (data._data[uVar38]._data
                                    [data._data[uVar38]._sizeY * lVar42 + lVar20] == (void *)0x0)
                                goto LAB_00159835;
                                operator_delete__(data._data[uVar38]._data
                                                  [data._data[uVar38]._sizeY * lVar42 + lVar20]);
                                iVar37 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                              if ((iVar37 == 2) &&
                                 (data._data[uVar38]._data
                                  [data._data[uVar38]._sizeY * lVar42 + lVar20] != (void *)0x0)) {
                                operator_delete__(data._data[uVar38]._data
                                                  [data._data[uVar38]._sizeY * lVar42 + lVar20]);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                            }
LAB_00159835:
                            uVar38 = uVar38 + 1;
                            lVar28 = DAT_001eb6f8;
                            lVar35 = DAT_001eb6f8;
                          } while (uVar38 < (ulong)(DAT_001eb6f8 - lVar31 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar29 = 0;
                          lVar35 = lVar28;
                          do {
                            uVar38 = (ulong)(lVar35 - lVar31) >> 2;
                            pvVar21 = *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar29
                                                          ) * (long)(int)lVar42 * 8 +
                                                 *(long *)((long)&data._data[uVar38]._data + lVar29)
                                                + (long)(int)lVar20 * 8);
                            if (pvVar21 != (void *)0x0) {
                              operator_delete__(pvVar21);
                              lVar31 = (anonymous_namespace)::channelTypes;
                              lVar28 = DAT_001eb6f8;
                              lVar35 = DAT_001eb6f8;
                            }
                            lVar29 = lVar29 + 0x18;
                          } while (lVar41 != lVar29);
                        }
                        bVar3 = iVar26 < box.max.x;
                        lVar29 = lVar35;
                        iVar49 = box.max.y;
                        iVar50 = box.max.x;
                        iVar26 = iVar26 + 1;
                      } while (bVar3);
                    }
                    bVar3 = iVar48 < iVar49;
                    iVar48 = iVar48 + 1;
                  } while (bVar3);
                }
              }
            }
          }
          else {
            for (iVar48 = 0; iVar49 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file),
                iVar48 < iVar49; iVar48 = iVar48 + 1) {
              for (iVar49 = 0; iVar50 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file),
                  iVar49 < iVar50; iVar49 = iVar49 + 1) {
                Imf_3_4::DeepTiledInputFile::readPixelSampleCount
                          ((int)&file,iVar49,iVar48,(int)local_370);
                Imf_3_4::DeepTiledInputFile::dataWindowForTile((int)&box,(int)&file,iVar49,iVar48);
                iVar26 = box.max.x;
                iVar50 = box.min.x;
                local_340 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar31 = (long)box.min.x;
                  lVar28 = (long)_ss;
                  lVar29 = DAT_001eb710 * local_378;
                  iVar8 = box.max.x + 1;
                  iVar37 = box.max.y + 1;
                  do {
                    if (iVar50 <= iVar26) {
                      lVar42 = local_340 - local_1b4;
                      local_368 = (void *)(lVar42 * 0x444 + (long)pvVar17);
                      lVar35 = lVar31;
                      do {
                        lVar32 = lVar35 - lVar28;
                        uVar30 = *(uint *)((long)local_368 + lVar32 * 4);
                        uVar38 = (ulong)uVar30;
                        lVar20 = lVar29 * 0x18 + DAT_001eb718;
                        if (uVar30 != *(uint *)(*(long *)(lVar20 + 8 + local_370 * 0x18) * lVar42 *
                                                4 + *(long *)(lVar20 + 0x10 + local_370 * 0x18) +
                                               lVar32 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x28c,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001eb6f8 != (anonymous_namespace)::channelTypes) {
                          local_380 = uVar38 * 2;
                          lVar40 = 4;
                          uVar36 = 0;
                          lVar20 = (anonymous_namespace)::channelTypes;
                          do {
                            iVar25 = *(int *)(lVar20 + uVar36 * 4);
                            if (iVar25 == 0) {
                              pvVar21 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar42 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar21;
                              iVar25 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                              lVar20 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar25 == 1) {
                              pvVar21 = operator_new__(local_380);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar42 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar21;
                              iVar25 = *(int *)((anonymous_namespace)::channelTypes + uVar36 * 4);
                              lVar20 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar25 == 2) {
                              pvVar21 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar42 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar21;
                              lVar20 = (anonymous_namespace)::channelTypes;
                            }
                            uVar36 = uVar36 + 1;
                            lVar40 = lVar40 + 6;
                          } while (uVar36 < (ulong)(DAT_001eb6f8 - lVar20 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar20 = 0;
                          do {
                            pvVar21 = operator_new__(uVar38 << 2);
                            uVar36 = (ulong)(DAT_001eb6f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar36]._sizeY + lVar20) * lVar42
                                       * 8 + *(long *)((long)&data._data[uVar36]._data + lVar20) +
                                      lVar32 * 8) = pvVar21;
                            lVar20 = lVar20 + 0x18;
                          } while (lVar41 != lVar20);
                        }
                        lVar35 = lVar35 + 1;
                      } while (iVar8 != (int)lVar35);
                    }
                    local_340 = local_340 + 1;
                  } while (iVar37 != (int)local_340);
                }
                Imf_3_4::DeepTiledInputFile::readTile((int)&file,iVar49,iVar48,(int)local_370);
              }
            }
          }
          if (!relativeCoords) {
            uVar38 = 0;
            while (iVar48 = Imf_3_4::DeepTiledInputFile::levelHeight((int)&file),
                  (long)uVar38 < (long)iVar48) {
              uVar36 = uVar38;
              local_380 = uVar38;
              for (lVar31 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::levelWidth((int)&file),
                  lVar31 < iVar48; lVar31 = lVar31 + 1) {
                if (0 < channelCount) {
                  iVar48 = (int)lVar31;
                  uVar30 = (uint)(iVar48 + (int)uVar38 * 0x111) % 0x801;
                  local_368 = (void *)(ulong)uVar30;
                  fVar43 = (float)uVar30;
                  uVar33 = 0;
                  do {
                    if (((!randomChannels) ||
                        (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar33] == 1)) &&
                       (*(int *)((long)pvVar17 + lVar31 * 4 + uVar38 * 0x444) != 0)) {
                      uVar39 = 0;
                      do {
                        iVar49 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
                        if (iVar49 == 0) {
                          pvVar21 = data._data[uVar33]._data
                                    [data._data[uVar33]._sizeY * uVar36 + lVar31];
                          if (*(int *)((long)pvVar21 + uVar39 * 4) != (int)local_368) {
                            poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar48);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)uVar36);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar19," error, should be ",0x12);
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)local_368);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", is ",5);
                            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) +
                                            (char)poVar19);
                            std::ostream::put((char)poVar19);
                            std::ostream::flush();
                            std::ostream::flush();
                            if (*(int *)((long)pvVar21 + uVar39 * 4) != (int)local_368) {
                              __assert_fail("value[l] == static_cast<unsigned int> ( i * width + j) % 2049"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                            ,0x324,
                                            "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                           );
                            }
                          }
                          iVar49 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
                        }
                        if (iVar49 == 1) {
                          ppvVar23 = data._data[uVar33]._data;
                          lVar28 = data._data[uVar33]._sizeY * uVar36;
                          pvVar21 = ppvVar23[lVar28 + lVar31];
                          fVar1 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)((long)pvVar21 + uVar39 * 2) * 4);
                          if ((fVar1 != fVar43) || (NAN(fVar1) || NAN(fVar43))) {
                            poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar48);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)local_380);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar19," error, should be ",0x12);
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)local_368);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", is ",5);
                            plVar22 = (long *)::operator<<(poVar19,(half)*(uint16_t *)
                                                                          ((long)pvVar21 +
                                                                          uVar39 * 2));
                            std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22)
                            ;
                            std::ostream::put((char)plVar22);
                            std::ostream::flush();
                            std::ostream::flush();
                            ppvVar23 = data._data[uVar33]._data;
                            lVar28 = data._data[uVar33]._sizeY * local_380;
                          }
                          fVar1 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)
                                                    ((long)ppvVar23[lVar28 + lVar31] + uVar39 * 2) *
                                            4);
                          if ((fVar1 != fVar43) || (NAN(fVar1) || NAN(fVar43))) {
                            __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x331,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          iVar49 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
                          uVar36 = local_380;
                        }
                        if (iVar49 == 2) {
                          ppvVar23 = data._data[uVar33]._data;
                          lVar28 = data._data[uVar33]._sizeY * uVar36;
                          pvVar21 = ppvVar23[lVar28 + lVar31];
                          fVar1 = *(float *)((long)pvVar21 + uVar39 * 4);
                          if ((fVar1 != fVar43) || (NAN(fVar1) || NAN(fVar43))) {
                            poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar48);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)local_380);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar19," error, should be ",0x12);
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)local_368);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", is ",5);
                            poVar19 = std::ostream::_M_insert<double>
                                                ((double)*(float *)((long)pvVar21 + uVar39 * 4));
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) +
                                            (char)poVar19);
                            std::ostream::put((char)poVar19);
                            std::ostream::flush();
                            std::ostream::flush();
                            ppvVar23 = data._data[uVar33]._data;
                            lVar28 = data._data[uVar33]._sizeY * local_380;
                          }
                          fVar1 = *(float *)((long)ppvVar23[lVar28 + lVar31] + uVar39 * 4);
                          if ((fVar1 != fVar43) || (uVar36 = local_380, NAN(fVar1) || NAN(fVar43)))
                          {
                            __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x33e,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                        uVar39 = uVar39 + 1;
                      } while (uVar39 < *(uint *)((long)pvVar17 + lVar31 * 4 + uVar38 * 0x444));
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 != __n_00);
                }
              }
              uVar38 = uVar36 + 1;
            }
            for (lVar31 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::levelHeight((int)&file),
                lVar31 < iVar48; lVar31 = lVar31 + 1) {
              for (lVar28 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::levelWidth((int)&file),
                  lVar28 < iVar48; lVar28 = lVar28 + 1) {
                if (0 < channelCount) {
                  lVar35 = 4;
                  uVar38 = 0;
                  lVar29 = (anonymous_namespace)::channelTypes;
                  do {
                    iVar48 = *(int *)(lVar29 + uVar38 * 4);
                    if (iVar48 == 0) {
                      pvVar21 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar31 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                          lVar28 * 8);
                      if (pvVar21 != (void *)0x0) {
                        operator_delete__(pvVar21);
                        iVar48 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                        lVar29 = (anonymous_namespace)::channelTypes;
                        goto LAB_0015a20a;
                      }
                    }
                    else {
LAB_0015a20a:
                      if (iVar48 == 1) {
                        pvVar21 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar31
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar35 * 4) + lVar28 * 8);
                        if (pvVar21 == (void *)0x0) goto LAB_0015a26e;
                        operator_delete__(pvVar21);
                        iVar48 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                        lVar29 = (anonymous_namespace)::channelTypes;
                      }
                      if ((iVar48 == 2) &&
                         (pvVar21 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) *
                                               lVar31 * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                              lVar28 * 8), pvVar21 != (void *)0x0)) {
                        operator_delete__(pvVar21);
                        lVar29 = (anonymous_namespace)::channelTypes;
                      }
                    }
LAB_0015a26e:
                    uVar38 = uVar38 + 1;
                    lVar35 = lVar35 + 6;
                  } while (__n_00 != uVar38);
                }
                if (0 < (int)uVar7) {
                  lVar42 = 0;
                  lVar29 = DAT_001eb6f8;
                  lVar35 = (anonymous_namespace)::channelTypes;
                  do {
                    uVar38 = (ulong)(lVar29 - lVar35) >> 2;
                    pvVar21 = *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar42) *
                                         lVar31 * 8 +
                                         *(long *)((long)&data._data[uVar38]._data + lVar42) +
                                        lVar28 * 8);
                    if (pvVar21 != (void *)0x0) {
                      operator_delete__(pvVar21);
                      lVar29 = DAT_001eb6f8;
                      lVar35 = (anonymous_namespace)::channelTypes;
                    }
                    lVar42 = lVar42 + 0x18;
                  } while (lVar41 != lVar42);
                }
              }
            }
          }
          local_370 = local_370 + 1;
        }
        local_378 = local_378 + 1;
      }
      goto LAB_0015a33a;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_0015a33a:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar17);
  if (local_2f0 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0);
  }
  if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
  }
  return;
}

Assistant:

void
readFile (
    int                channelCount,
    bool               bulkRead,
    bool               relativeCoords,
    bool               randomChannels,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str (), 4);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());
    assert (fileHeader.tileDescription () == header.tileDescription ());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&localSampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    vector<int> read_channel (channelCount);
    int         channels_added = 0;
    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str,
                DeepSlice (
                    type,
                    (char*) (&data[i][0][0] - memOffset),
                    pointerSize * 1,
                    pointerSize * width,
                    sampleSize,
                    1,
                    1,
                    0,
                    relativeCoords,
                    relativeCoords));
            channels_added++;
        }
    }
    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i + channelCount][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);

                for (int i = 0; i < file.numYTiles (ly); i++)
                {
                    for (int j = 0; j < file.numXTiles (lx); j++)
                    {
                        Box2i box = file.dataWindowForTile (j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert (
                                    localSampleCount[dwy][dwx] ==
                                    sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size ();
                                     k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int
                                            [localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[localSampleCount[dwy]
                                                                     [dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[localSampleCount[dwy]
                                                                      [dwx]];
                                }

                                for (int f = 0; f < fillChannels; ++f)
                                {
                                    data[f + channelTypes.size ()][dwy][dwx] =
                                        new float[localSampleCount[dwy][dwx]];
                                }
                            }
                    }
                }

                file.readTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert (
                                        localSampleCount[dwy][dwx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[localSampleCount[dwy]
                                                                         [dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][dwy]
                                            [dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;
                                    assert (
                                        localSampleCount[ty][tx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            if (channelTypes[k] == 0)
                                                data[k][ty][tx] =
                                                    new unsigned int
                                                        [localSampleCount[ty]
                                                                         [tx]];
                                            if (channelTypes[k] == 1)
                                                data[k][ty][tx] = new half
                                                    [localSampleCount[ty][tx]];
                                            if (channelTypes[k] == 2)
                                                data[k][ty][tx] = new float
                                                    [localSampleCount[ty][tx]];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][ty][tx] =
                                            new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            checkValue (
                                                data[k][ty][tx],
                                                localSampleCount[ty][tx],
                                                channelTypes[k],
                                                dwx,
                                                dwy);
                                            if (channelTypes[k] == 0)
                                                delete[] (unsigned int*)
                                                    data[k][ty][tx];
                                            if (channelTypes[k] == 1)
                                                delete[] (
                                                    half*) data[k][ty][tx];
                                            if (channelTypes[k] == 2)
                                                delete[] (
                                                    float*) data[k][ty][tx];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        delete[] (float*)
                                            data[f + channelTypes.size ()][ty]
                                                [tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (!randomChannels || read_channel[k] == 1)
                            {
                                for (unsigned int l = 0;
                                     l < localSampleCount[i][j];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value =
                                            (unsigned int*) (data[k][i][j]);
                                        if (value[l] !=
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            value[l] ==
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((half*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((float*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[] (unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[] (half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[] (float*) data[k][i][j];
                        }
                        for (int f = 0; f < fillChannels; ++f)
                        {
                            delete[] (
                                float*) data[f + channelTypes.size ()][i][j];
                        }
                    }
            }
        }
}